

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

int svd(double *A,int M,int N,double *U,double *V,double *q)

{
  long lVar1;
  size_t __size;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  void *__ptr;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  double *pdVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  double *pdVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  uint uVar23;
  double *pdVar24;
  uint uVar25;
  long lVar26;
  void *pvVar27;
  double *pdVar28;
  uint uVar29;
  uint uVar30;
  ulong uVar31;
  double *pdVar32;
  uint uVar33;
  ulong uVar34;
  long lVar35;
  uint uVar36;
  uint uVar37;
  double *pdVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double macheps;
  double dVar45;
  double dVar46;
  double dVar47;
  double *local_138;
  int local_f0;
  ulong local_e8;
  ulong local_d0;
  double *local_68;
  void *local_58;
  double local_50;
  int local_38;
  
  if (M < N) {
    puts("Rows (M) should be greater than Columns (B) ");
    printf("Retry By Transposing the Input Matrix");
    iVar3 = -1;
  }
  else {
    uVar6 = (ulong)N;
    __size = uVar6 * 8;
    __ptr = malloc(__size);
    dVar45 = 1.0;
    do {
      dVar45 = dVar45 * 0.5;
    } while (1.0 < dVar45 + 1.0);
    if (0 < N * M) {
      uVar12 = 0;
      do {
        U[uVar12] = A[uVar12];
        uVar12 = uVar12 + 1;
      } while ((uint)(N * M) != uVar12);
    }
    if (0 < N) {
      uVar7 = (ulong)(N - 1);
      uVar13 = (ulong)(uint)N;
      lVar19 = (long)M;
      uVar8 = (ulong)(uint)M;
      pdVar32 = U + 1;
      pdVar16 = U + uVar13;
      uVar14 = 1;
      dVar46 = 0.0;
      dVar43 = 0.0;
      uVar15 = 0;
      uVar12 = 0;
      uVar31 = uVar13;
      uVar34 = uVar8;
      pdVar24 = U;
      dVar40 = 0.0;
      local_68 = U;
      local_58 = __ptr;
      do {
        *(double *)((long)__ptr + uVar12 * 8) = dVar46 * dVar43;
        dVar46 = 0.0;
        dVar43 = 0.0;
        uVar9 = uVar34;
        pdVar10 = pdVar24;
        if ((long)uVar12 < lVar19) {
          do {
            dVar46 = dVar46 + ABS(*pdVar10);
            uVar9 = uVar9 - 1;
            pdVar10 = pdVar10 + uVar13;
          } while (uVar9 != 0);
          dVar43 = 0.0;
          if ((dVar46 != 0.0) || (NAN(dVar46))) {
            dVar47 = 0.0;
            uVar9 = uVar34;
            pdVar10 = pdVar24;
            if ((long)uVar12 < lVar19) {
              do {
                dVar43 = *pdVar10 / dVar46;
                *pdVar10 = dVar43;
                dVar47 = dVar47 + dVar43 * dVar43;
                uVar9 = uVar9 - 1;
                pdVar10 = pdVar10 + uVar13;
              } while (uVar9 != 0);
            }
            iVar3 = (N + 1) * (int)uVar12;
            dVar41 = U[iVar3];
            if (dVar47 < 0.0) {
              dVar43 = sqrt(dVar47);
            }
            else {
              dVar43 = SQRT(dVar47);
            }
            dVar43 = (double)(~-(ulong)(dVar41 < 0.0) & (ulong)-dVar43 |
                             -(ulong)(dVar41 < 0.0) & (ulong)dVar43);
            U[iVar3] = dVar41 - dVar43;
            if (uVar12 < uVar7) {
              pdVar10 = pdVar32;
              uVar9 = uVar14;
              do {
                dVar39 = 0.0;
                lVar26 = 0;
                uVar20 = uVar34;
                do {
                  dVar39 = dVar39 + *(double *)((long)pdVar24 + lVar26) *
                                    *(double *)((long)pdVar10 + lVar26);
                  lVar26 = lVar26 + uVar13 * 8;
                  uVar20 = uVar20 - 1;
                } while (uVar20 != 0);
                lVar26 = 0;
                uVar20 = uVar34;
                do {
                  *(double *)((long)pdVar10 + lVar26) =
                       *(double *)((long)pdVar24 + lVar26) * (dVar39 / (dVar41 * dVar43 - dVar47)) +
                       *(double *)((long)pdVar10 + lVar26);
                  lVar26 = lVar26 + uVar13 * 8;
                  uVar20 = uVar20 - 1;
                } while (uVar20 != 0);
                uVar9 = uVar9 + 1;
                pdVar10 = pdVar10 + 1;
              } while (uVar9 != uVar13);
            }
            uVar9 = uVar34;
            pdVar10 = pdVar24;
            if ((long)uVar12 < lVar19) {
              do {
                *pdVar10 = *pdVar10 * dVar46;
                uVar9 = uVar9 - 1;
                pdVar10 = pdVar10 + uVar13;
              } while (uVar9 != 0);
            }
          }
        }
        uVar9 = uVar12 + 1;
        q[uVar12] = dVar46 * dVar43;
        dVar43 = 0.0;
        dVar46 = 0.0;
        if ((uVar12 != uVar7) && ((long)uVar9 < lVar19)) {
          uVar20 = 1;
          do {
            dVar46 = dVar46 + ABS(local_68[uVar15 + uVar20]);
            uVar20 = uVar20 + 1;
          } while (uVar34 != uVar20);
          dVar43 = 0.0;
          if ((dVar46 != 0.0) || (NAN(dVar46))) {
            dVar47 = 0.0;
            if ((long)uVar9 < (long)uVar6) {
              uVar20 = 1;
              do {
                dVar43 = local_68[uVar15 + uVar20] / dVar46;
                local_68[uVar15 + uVar20] = dVar43;
                dVar47 = dVar47 + dVar43 * dVar43;
                uVar20 = uVar20 + 1;
              } while (uVar31 != uVar20);
            }
            uVar23 = (int)uVar12 * N + (int)uVar9;
            dVar41 = U[uVar23];
            if (dVar47 < 0.0) {
              dVar43 = sqrt(dVar47);
            }
            else {
              dVar43 = SQRT(dVar47);
            }
            dVar43 = (double)(~-(ulong)(dVar41 < 0.0) & (ulong)-dVar43 |
                             -(ulong)(dVar41 < 0.0) & (ulong)dVar43);
            U[uVar23] = dVar41 - dVar43;
            if ((long)uVar9 < (long)uVar6) {
              uVar20 = 1;
              do {
                *(double *)((long)local_58 + uVar20 * 8) =
                     local_68[uVar15 + uVar20] / (dVar41 * dVar43 - dVar47);
                uVar20 = uVar20 + 1;
              } while (uVar31 != uVar20);
            }
            pdVar10 = pdVar16;
            uVar20 = uVar14;
            if ((long)uVar9 < lVar19) {
              do {
                if ((long)uVar9 < (long)uVar6) {
                  dVar47 = 0.0;
                  uVar21 = 1;
                  do {
                    dVar47 = dVar47 + pdVar10[uVar21] * local_68[uVar15 + uVar21];
                    uVar21 = uVar21 + 1;
                  } while (uVar31 != uVar21);
                  if ((long)uVar9 < (long)uVar6) {
                    uVar21 = 1;
                    do {
                      pdVar10[uVar21] =
                           *(double *)((long)local_58 + uVar21 * 8) * dVar47 + pdVar10[uVar21];
                      uVar21 = uVar21 + 1;
                    } while (uVar31 != uVar21);
                  }
                }
                uVar20 = uVar20 + 1;
                pdVar10 = pdVar10 + uVar13;
              } while (uVar20 != uVar8);
            }
            if ((long)uVar9 < (long)uVar6) {
              uVar20 = 1;
              do {
                local_68[uVar15 + uVar20] = local_68[uVar15 + uVar20] * dVar46;
                uVar20 = uVar20 + 1;
              } while (uVar31 != uVar20);
            }
          }
        }
        dVar47 = ABS(*(double *)((long)__ptr + uVar12 * 8)) + ABS(q[uVar12]);
        if (dVar47 <= dVar40) {
          dVar47 = dVar40;
        }
        uVar14 = uVar14 + 1;
        pdVar24 = pdVar24 + uVar13 + 1;
        uVar34 = uVar34 - 1;
        pdVar32 = pdVar32 + uVar13 + 1;
        local_68 = local_68 + 1;
        uVar15 = (ulong)(uint)((int)uVar15 + N);
        uVar31 = uVar31 - 1;
        local_58 = (void *)((long)local_58 + 8);
        pdVar16 = pdVar16 + uVar13 + 1;
        uVar12 = uVar9;
        dVar40 = dVar47;
      } while (uVar9 != uVar13);
      if (0 < N) {
        lVar26 = (uVar6 - 1) * uVar6;
        pdVar32 = U + lVar26;
        pdVar16 = V + uVar6;
        pdVar24 = V + lVar26;
        uVar12 = uVar6;
        pdVar10 = V;
        do {
          pdVar10 = pdVar10 + -1;
          pdVar16 = pdVar16 + -1;
          uVar31 = uVar12 - 1;
          if ((long)uVar12 <= (long)uVar7) {
            local_38 = (int)uVar12;
            uVar34 = (ulong)local_38;
            if (((dVar43 != 0.0) || (NAN(dVar43))) && (local_38 < N)) {
              pdVar28 = (double *)((uVar6 * 8 + 8) * uVar34 + (long)V);
              pdVar38 = (double *)((long)pdVar16 + __size * uVar34);
              dVar40 = U[uVar31 * uVar6 + uVar12];
              uVar15 = (ulong)local_38;
              do {
                *pdVar38 = pdVar32[uVar15] / (dVar43 * dVar40);
                uVar15 = uVar15 + 1;
                pdVar38 = pdVar38 + uVar6;
              } while (uVar6 != uVar15);
              if (local_38 < N) {
                uVar15 = (long)local_38;
                do {
                  dVar43 = 0.0;
                  pdVar38 = pdVar28;
                  uVar14 = (long)local_38;
                  do {
                    dVar43 = dVar43 + pdVar32[uVar14] * *pdVar38;
                    uVar14 = uVar14 + 1;
                    pdVar38 = pdVar38 + uVar6;
                  } while (uVar6 != uVar14);
                  lVar35 = 0;
                  lVar26 = uVar6 - uVar34;
                  do {
                    *(double *)((long)pdVar28 + lVar35) =
                         *(double *)((long)pdVar10 + lVar35 + (uVar34 * 8 + 8) * uVar6) * dVar43 +
                         *(double *)((long)pdVar28 + lVar35);
                    lVar35 = lVar35 + __size;
                    lVar26 = lVar26 + -1;
                  } while (lVar26 != 0);
                  uVar15 = uVar15 + 1;
                  pdVar28 = pdVar28 + 1;
                } while (uVar15 != uVar6);
              }
            }
            if (local_38 < N) {
              pdVar38 = (double *)(__size * uVar34 + (long)pdVar16);
              do {
                *pdVar38 = 0.0;
                pdVar24[uVar34] = 0.0;
                uVar34 = uVar34 + 1;
                pdVar38 = pdVar38 + uVar6;
              } while (uVar6 != uVar34);
            }
          }
          V[uVar31 + (long)((int)uVar31 * N)] = 1.0;
          dVar43 = *(double *)((long)__ptr + uVar31 * 8);
          pdVar32 = pdVar32 + -uVar6;
          pdVar24 = pdVar24 + -uVar6;
          bVar2 = 1 < (long)uVar12;
          uVar12 = uVar31;
        } while (bVar2);
        if (0 < N) {
          uVar11 = N * N;
          uVar4 = ~N;
          pdVar32 = U + uVar6 * uVar6 + -1;
          uVar5 = (N + 1) * N;
          uVar36 = uVar5 - 1;
          uVar37 = uVar11 - 1;
          uVar31 = 0;
          uVar12 = uVar6;
          local_e8 = uVar7;
          uVar23 = uVar11;
          do {
            dVar43 = q[uVar12 - 1];
            if ((long)uVar12 < (long)uVar6 && (long)uVar12 <= (long)uVar7) {
              memset(U + (int)(uVar4 * (int)uVar31 + uVar11),0,
                     (uVar31 * 8 + 0x7fffffff8 & 0x7fffffff8) + 8);
            }
            uVar34 = uVar12 - 1;
            if ((dVar43 != 0.0) || (NAN(dVar43))) {
              if (uVar34 != uVar7 && (long)uVar12 < (long)uVar6) {
                uVar15 = uVar12 & 0xffffffff;
                uVar18 = uVar23;
                uVar25 = uVar5;
                do {
                  dVar40 = 0.0;
                  uVar14 = uVar12 & 0xffffffff;
                  uVar30 = uVar36;
                  uVar33 = uVar25;
                  do {
                    dVar40 = dVar40 + U[uVar30] * U[uVar33];
                    uVar33 = uVar33 + N;
                    uVar30 = uVar30 + N;
                    uVar29 = (int)uVar14 + 1;
                    uVar14 = (ulong)uVar29;
                  } while ((int)uVar29 < M);
                  dVar46 = U[uVar34 * (uVar6 + 1)];
                  uVar14 = local_e8;
                  uVar30 = uVar18;
                  uVar33 = uVar37;
                  do {
                    U[uVar30] = U[uVar33] * ((dVar40 / dVar46) / dVar43) + U[uVar30];
                    uVar30 = uVar30 + N;
                    uVar33 = uVar33 + N;
                    uVar29 = (int)uVar14 + 1;
                    uVar14 = (ulong)uVar29;
                  } while ((int)uVar29 < M);
                  uVar30 = (int)uVar15 + 1;
                  uVar15 = (ulong)uVar30;
                  uVar25 = uVar25 + 1;
                  uVar18 = uVar18 + 1;
                } while (uVar30 != N);
              }
              uVar15 = lVar19 + 1U;
              pdVar16 = pdVar32;
              if ((long)uVar12 <= lVar19) {
                do {
                  *pdVar16 = *pdVar16 / dVar43;
                  uVar15 = uVar15 - 1;
                  pdVar16 = pdVar16 + uVar6;
                } while (uVar12 != uVar15);
              }
            }
            else {
              uVar15 = lVar19 + 1U;
              pdVar16 = pdVar32;
              if ((long)uVar12 <= lVar19) {
                do {
                  *pdVar16 = 0.0;
                  pdVar16 = pdVar16 + uVar6;
                  uVar15 = uVar15 - 1;
                } while (uVar12 != uVar15);
              }
            }
            lVar26 = (long)((int)uVar34 * N);
            U[uVar34 + lVar26] = U[uVar34 + lVar26] + 1.0;
            uVar31 = uVar31 + 1;
            pdVar32 = (double *)((long)pdVar32 + (__size ^ 0xfffffffffffffff8));
            uVar5 = uVar5 + uVar4;
            uVar36 = uVar36 + uVar4;
            uVar23 = uVar23 + uVar4;
            uVar37 = uVar37 + uVar4;
            local_e8 = (ulong)((int)local_e8 - 1);
            uVar12 = uVar34;
          } while (uVar31 != uVar13);
          if (0 < N) {
            dVar47 = (dVar45 + dVar45) * dVar47;
            pvVar27 = (void *)((long)__ptr + uVar7 * 8);
            pdVar32 = q + uVar7;
            local_138 = V + uVar6;
            local_d0 = uVar6 - 1;
            local_f0 = N;
LAB_00122160:
            local_138 = local_138 + -1;
            pdVar32 = pdVar32 + -1;
            uVar12 = local_d0 - 1;
            iVar3 = 1;
            do {
              lVar19 = 0;
              iVar22 = local_f0;
              do {
                if (ABS(*(double *)((long)pvVar27 + lVar19)) <= dVar47) {
                  uVar23 = iVar22 - 1;
                  goto LAB_001222f7;
                }
                if (ABS(*(double *)((long)pdVar32 + lVar19)) <= dVar47) break;
                iVar22 = iVar22 + -1;
                lVar19 = lVar19 + -8;
              } while (0 < iVar22);
              uVar23 = iVar22 - 1;
              lVar19 = (long)(int)uVar23;
              if (lVar19 <= (long)local_d0) {
                dVar45 = 0.0;
                lVar35 = 0;
                dVar43 = 1.0;
                lVar26 = lVar19;
                do {
                  dVar40 = *(double *)((long)__ptr + lVar26 * 8);
                  dVar43 = dVar43 * dVar40;
                  *(double *)((long)__ptr + lVar26 * 8) = dVar45 * dVar40;
                  if (ABS(dVar43) <= dVar47) break;
                  dVar45 = q[lVar26];
                  dVar40 = hypot(dVar43,dVar45);
                  q[lVar26] = dVar40;
                  dVar45 = dVar45 / dVar40;
                  dVar43 = -dVar43 / dVar40;
                  uVar31 = uVar8;
                  pdVar16 = U + lVar19;
                  do {
                    dVar40 = pdVar16[-1];
                    dVar46 = *(double *)((long)pdVar16 + lVar35);
                    pdVar16[-1] = dVar40 * dVar45 + dVar43 * dVar46;
                    *(double *)((long)pdVar16 + lVar35) = dVar46 * dVar45 - dVar43 * dVar40;
                    pdVar16 = pdVar16 + uVar6;
                    uVar31 = uVar31 - 1;
                  } while (uVar31 != 0);
                  lVar35 = lVar35 + 8;
                  bVar2 = lVar26 < (long)local_d0;
                  lVar26 = lVar26 + 1;
                } while (bVar2);
              }
LAB_001222f7:
              dVar45 = q[local_d0];
              if (local_d0 == uVar23) goto LAB_001226fb;
              lVar19 = (long)(int)uVar23;
              local_50 = q[lVar19];
              dVar43 = q[uVar12];
              dVar40 = *(double *)((long)__ptr + uVar12 * 8);
              dVar46 = *(double *)((long)__ptr + local_d0 * 8);
              dVar40 = ((dVar43 / dVar46 +
                        ((dVar40 - dVar45) / dVar43) * ((dVar45 + dVar40) / dVar46)) -
                       dVar46 / dVar43) * 0.5;
              dVar41 = hypot(dVar40,1.0);
              dVar45 = (dVar46 / local_50) *
                       (dVar43 / ((double)((ulong)-dVar41 & -(ulong)(dVar40 < 0.0) |
                                          ~-(ulong)(dVar40 < 0.0) & (ulong)dVar41) + dVar40) -
                       dVar46) + (local_50 - (dVar45 / local_50) * dVar45);
              if (lVar19 < (long)local_d0) {
                pdVar16 = V + lVar19 + 1;
                lVar35 = lVar19 << 0x20;
                pdVar24 = U + lVar19 + 1;
                dVar43 = 1.0;
                lVar26 = lVar19;
                dVar40 = dVar43;
                do {
                  lVar1 = lVar26 + 1;
                  dVar46 = *(double *)((long)__ptr + lVar26 * 8 + 8);
                  dVar41 = q[lVar26 + 1];
                  dVar40 = dVar40 * dVar46;
                  dVar43 = dVar43 * dVar46;
                  dVar46 = hypot(dVar45,dVar40);
                  *(double *)((long)__ptr + lVar26 * 8) = dVar46;
                  dVar45 = dVar45 / dVar46;
                  dVar46 = dVar40 / dVar46;
                  dVar39 = local_50 * dVar45 + dVar43 * dVar46;
                  dVar44 = dVar43 * dVar45 - dVar46 * local_50;
                  dVar40 = dVar41 * dVar46;
                  dVar41 = dVar41 * dVar45;
                  uVar31 = uVar13;
                  lVar17 = lVar35;
                  pdVar10 = pdVar16;
                  do {
                    dVar43 = *(double *)((long)V + (lVar17 >> 0x1d));
                    dVar42 = *pdVar10;
                    *(double *)((long)V + (lVar17 >> 0x1d)) = dVar43 * dVar45 + dVar46 * dVar42;
                    *pdVar10 = dVar42 * dVar45 - dVar46 * dVar43;
                    pdVar10 = pdVar10 + uVar6;
                    lVar17 = lVar17 + (uVar6 << 0x20);
                    uVar31 = uVar31 - 1;
                  } while (uVar31 != 0);
                  dVar42 = hypot(dVar39,dVar40);
                  q[lVar26] = dVar42;
                  dVar40 = dVar40 / dVar42;
                  if ((dVar42 == 0.0) && (!NAN(dVar42))) {
                    dVar40 = dVar46;
                  }
                  dVar43 = dVar39 / dVar42;
                  if ((dVar42 == 0.0) && (!NAN(dVar42))) {
                    dVar43 = dVar45;
                  }
                  dVar45 = dVar43 * dVar44 + dVar41 * dVar40;
                  local_50 = dVar43 * dVar41 - dVar44 * dVar40;
                  uVar31 = uVar8;
                  lVar26 = lVar35;
                  pdVar10 = pdVar24;
                  do {
                    dVar46 = *(double *)((long)U + (lVar26 >> 0x1d));
                    dVar41 = *pdVar10;
                    *(double *)((long)U + (lVar26 >> 0x1d)) = dVar46 * dVar43 + dVar40 * dVar41;
                    *pdVar10 = dVar41 * dVar43 - dVar40 * dVar46;
                    pdVar10 = pdVar10 + uVar6;
                    lVar26 = lVar26 + (uVar6 << 0x20);
                    uVar31 = uVar31 - 1;
                  } while (uVar31 != 0);
                  pdVar16 = pdVar16 + 1;
                  lVar35 = lVar35 + 0x100000000;
                  pdVar24 = pdVar24 + 1;
                  lVar26 = lVar1;
                } while (lVar1 < (long)local_d0);
              }
              *(undefined8 *)((long)__ptr + lVar19 * 8) = 0;
              *(double *)((long)__ptr + local_d0 * 8) = dVar45;
              q[local_d0] = local_50;
              iVar3 = iVar3 + 1;
              if (iVar3 == 0x33) {
                puts("Convergence Not Achieved ");
                return 0xf;
              }
            } while( true );
          }
        }
      }
    }
LAB_00122763:
    svd_sort(U,M,N,V,q);
    free(__ptr);
    iVar3 = 0;
  }
  return iVar3;
LAB_001226fb:
  if (dVar45 < 0.0) {
    q[local_d0] = -dVar45;
    uVar31 = uVar13;
    pdVar16 = local_138;
    do {
      *pdVar16 = -*pdVar16;
      pdVar16 = pdVar16 + uVar6;
      uVar31 = uVar31 - 1;
    } while (uVar31 != 0);
  }
  local_f0 = local_f0 + -1;
  pvVar27 = (void *)((long)pvVar27 + -8);
  bVar2 = (long)local_d0 < 1;
  local_d0 = uVar12;
  if (bVar2) goto LAB_00122763;
  goto LAB_00122160;
}

Assistant:

int svd(double *A,int M,int N,double *U,double *V,double *q) {
	int i,j,k,l,t,t2,ierr,cancel,iter,l1;
	double eps,g,x,s,temp,f,h,c,y,z,scale;
	double *e;
	/*
     THIS SUBROUTINE IS THE MODIFIED C TRANSLATION OF THE
     EISPACK FORTRAN TRANSLATION OF THE ALGOL PROCEDURE SVD,
     NUM. MATH. 14, 403-420(1970) BY GOLUB AND REINSCH.
     HANDBOOK FOR AUTO. COMP., VOL II-LINEAR ALGEBRA, 134-151(1971).
	 */
	/*
	 * U = MXN
	 * V - NXN
	 * Q - NX1
	 */

	/*
	 * The program return error codes
	 *
	 *  Code 0 if the computation is successful
	 *  Code -1 If  M < N . Transpose the matrix such that rows > columns and try again
	 *  Code 15 if maximum iterations are reached without achieving convergence. Increase SVDMAXITER value
	 *  in matrix.h header file. Default Value is 50
	 *
	 */
	if (M < N) {
		printf("Rows (M) should be greater than Columns (B) \n");
		printf("Retry By Transposing the Input Matrix");
		return -1;
	}
	e = (double*) malloc(sizeof(double) * N);
	ierr = 0;
	eps = macheps();
	g = scale = x = 0.0;

	for(i = 0; i < M*N;++i) {
		U[i] = A[i];
	}

	for(i = 0; i < N;++i) {
		l = i+1;
		e[i] = scale * g;
		g = 0.0;
		s = 0.0;
		scale = 0.0;

		if (i < M) {
			for(k = i; k < M;++k) {
				scale += fabs(U[k*N+i]);
			}

			if (scale != 0.0) {
				for(k = i; k < M;++k) {
					t = k * N;
					U[t+i] /= scale;
					temp = U[t+i];
					s += temp*temp;
				}
				f = U[i*N+i];
				g = (f < 0) ? sqrt(s) : -sqrt(s);
				h = f * g - s;
				U[i*N+i] = f - g;

				if (i < N - 1) {
					for(j = l; j < N;++j) {
						s = 0.0;
						for(k = i; k < M;++k) {
							t = k * N;
							s += U[t+i]*U[t+j];
						}
						f = s / h;
						for(k = i; k < M;++k) {
							t = k * N;
							U[t+j] += f * U[t+i];
						}
					}
				}
				for(k = i; k < M;++k) {
					t = k * N;
					U[t+i] *= scale;
				}
			}
		}
        q[i] = scale * g;
        g = 0.0;
        s = 0.0;
        scale = 0.0;

        if (i < M && i != N - 1) {
        	t = i *N;
        	for(k = l; k < M;++k) {
        		scale += fabs(U[t+k]);
        	}
        	if (scale != 0.0) {
        		for(k = l; k < N;++k) {
        			U[t+k] /= scale;
        			temp = U[t+k];
        			s = s + temp*temp;
        		}
        		f = U[t+l];
        		g = (f < 0) ? sqrt(s) : -sqrt(s);
                h = f * g - s;
                U[t+l] = f - g;
                for(k = l;k < N;++k) {
                	e[k] = U[t+k] / h;
                }

				for (j = l; j < M; j++) {
					s = 0.0;
					t2 = j * N;
					for (k = l; k < N; k++) {
						s += U[t2+k] * U[t+k];
					}
					for (k = l; k < N; k++) {
						U[t2+k] += s * e[k];
					}
				}
                for (k = l; k < N; k++)
                    U[t+k] *= scale;
        	}

        }

        temp = fabs(q[i]) + fabs(e[i]);

        if (x < temp) {
        	x = temp;
        }
	}

	/*
	ierr = 0;
	eps = macheps();
	tol = eps;
	g = x = 0.0;

	for(i = 0; i < M*N;++i) {
		U[i] = A[i];
	}

	for(i = 0; i < N;++i) {
		l = i+1;
		e[i] = g;
		s = 0.0;

		for(k = i; k < M;++k) {
			t = k * N;
			temp = U[t+i];
			s += temp*temp;
		}
		if (s < tol) {
			g = 0.0;
		} else {
			f = U[i*N+i];
			g = (f < 0) ? sqrt(s) : -sqrt(s);
			h = f * g - s;
			U[i*N+i] = f - g;

			for(j = l; j < N;++j) {
				s = 0.0;
				for(k = i; k < M;++k) {
					t = k * N;
					s += (U[t+i]*U[t+j]);
				}
				f = s / h;
				for(k = i; k < M;++k) {
					t = k * N;
					U[t+j] += (f * U[t+i]);
				}
			}

		}

        q[i] = g;
        s = 0.0;
        t = i * N;
    	for(k = l; k < N;++k) {
    		temp = U[t+k];
    		s = s + temp*temp;
    	}
        if (s < tol) {
        	g = 0.0;
        } else {
        	f = U[t+l];
			g = (f < 0) ? sqrt(s) : -sqrt(s);
			h = f * g - s;
            U[t+l] = f - g;
            for(k = l;k < N;++k) {
              	e[k] = U[t+k] / h;
            }

            for (j = l; j < M; j++) {
                s = 0.0;
                t2 = j * N;
                for (k = l; k < N; k++) {
                     s += U[t2+k] * U[t+k];
                }
                for (k = l; k < N; k++) {
                     U[t2+k] += s * e[k];
                }
            }

        }

        temp = fabs(q[i]) + fabs(e[i]);

        if (x < temp) {
        	x = temp;
        }
	}
*/


//Accumulating Right Hand Transformations

	for(i = N - 1;i >= 0;--i) {
		t = i * N;
		if (i < N - 1) {
			if (g != 0.0) {
				h = U[t+i+1] * g;
				for(j = l;j < N;++j) {
					V[j*N+i] = U[t+j] / h;
				}
				for(j = l;j < N;++j) {
					s = 0.0;
					for(k = l; k < N;++k) {
						s += U[t+k] * V[k*N+j];
					}
					for(k = l; k < N;++k) {
						V[k*N+j] += (s * V[k*N+i]);
					}
				}
			}
			for(j = l; j < N;++j) {
				V[t+j] = V[j*N+i] = 0.0;
			}
		}
	    V[t+i] = 1.0;
		g = e[i];
		l = i;
	}



//Accumulating Left Hand Transformations

	for(i = N - 1;i >= 0;--i) {
		t = i * N;
		l = i+1;
		g = q[i];

		if (i < N - 1) {
			for(j = l;j < N;++j) {
				U[t+j] = 0.0;
			}
		}

		if (g != 0.0) {
			if (i != N - 1) {
				//h = U[t+i] * g;
				for(j = l;j < N;++j) {
					s = 0.0;
					for(k = l; k < M;++k) {
						s += (U[k*N+i] * U[k*N+j]);
					}
					f = (s / U[t+i]) / g;
					for(k = i; k < M;++k) {
						U[k*N+j] += (f * U[k*N+i]);
					}
				}
			}
			for(j = i; j < M;++j) {
				U[j*N+i] = U[j*N+i] / g;
			}
		} else {
			for(j = i; j < M;++j) {
				U[j*N+i] = 0.0;
			}
		}

		U[t+i] += 1.0;
	}
//	mdisplay(U,M,N);

	eps = eps * x;

	for(k = N - 1; k >= 0; --k) {
		iter = 0;

		while(1) {
			iter++;
			if (iter > SVDMAXITER) {
				printf("Convergence Not Achieved \n");
				return 15;
			}

			cancel = 1;
			for(l = k; l >= 0; --l) {
				if (fabs(e[l]) <= eps) {
					cancel = 0; //test f convergence
					break;
				}
				if (fabs(q[l-1]) <= eps) {
					//Cancel
					break;
				}
			}
			if (cancel) {
				c = 0.0;
				s = 1.0;
				l1 = l - 1;
				for(i = l; i <= k;++i) {
					f = s*e[i];
					e[i] *= c;
					if (fabs(f) <= eps) {
						break;
					}
					g = q[i];
					h = q[i] = hypot(f,g);
					c = g/h;
					s = -f/h;
					for(j = 0; j < M;++j) {
						t = j * N;
						y = U[t+l1];
						z = U[t+i];

						U[t+l1] = y * c + z * s;
						U[t+i] = z * c - y * s;
					}
				}
			}
			z = q[k];
			if (l != k) {
				x = q[l];
				y = q[k-1];
				g = e[k-1];
				h = e[k];
				f = 0.5 * (((g + z) / h) * ((g - z) / y) + y / h - h / y);
				g = hypot(f,1.0);
				if (f < 0.0) {
					temp = f - g;
				} else {
					temp = f+g;
				}
				f = x - (z / x) * z + (h / x) * (y / temp - h);

				//Next QR Transformation

				c = s = 1.0;
				for(i = l+1; i <= k;++i) {
					g = e[i];
					y = q[i];
					h = s * g;
					g = c * g;
					e[i-1] = z = hypot(f,h);
                    c = f / z;
                    s = h / z;
                    f = x * c + g * s;
                    g = g * c - x * s;
                    h = y * s;
                    y *= c;
                    for(j = 0; j < N;++j) {
                    	t = j * N;
                        x = V[t+i-1];
                        z = V[t+i];
                        V[t+i-1] = x * c + z * s;
                        V[t+i] = z * c - x * s;
                    }
                    q[i-1] = z = hypot(f,h);
                    if (z != 0.0) {
                        c = f / z;
                        s = h / z;
                    }
                    f = c * g + s * y;
                    x = c * y - s * g;
                    for(j = 0; j < M;++j) {
                    	t = j * N;
                        y = U[t+i-1];
                        z = U[t+i];
                        U[t+i-1] = y * c + z * s;
                        U[t+i] = z * c - y * s;
                    }
				}
                    e[l] = 0.0;
                    e[k] = f;
                    q[k] = x;

			} else {
				//convergence
                if (z < 0.0) {
                    q[k] = -z;
                    for (j = 0; j < N; j++) {
                    	t = j *N;
                        V[t+k] = -V[t+k];
                    }
                }
                break;
			}
		}
	}

	svd_sort(U,M,N,V,q);

	free(e);
	return ierr;
}